

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O3

int X509v3_get_ext_by_OBJ(stack_st_X509_EXTENSION *x,ASN1_OBJECT *obj,int lastpos)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  size_t i;
  
  if (x == (stack_st_X509_EXTENSION *)0x0) {
LAB_0021a6f1:
    lastpos = -1;
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x);
    if (lastpos < 0) {
      lastpos = -1;
    }
    i = (size_t)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar2 <= (long)i) goto LAB_0021a6f1;
      puVar3 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)x,i);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)*puVar3,obj);
      lastpos = lastpos + 1;
    } while (iVar1 != 0);
  }
  return lastpos;
}

Assistant:

int X509v3_get_ext_by_OBJ(const STACK_OF(X509_EXTENSION) *sk,
                          const ASN1_OBJECT *obj, int lastpos) {
  if (sk == NULL) {
    return -1;
  }
  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }
  int n = (int)sk_X509_EXTENSION_num(sk);
  for (; lastpos < n; lastpos++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(sk, lastpos);
    if (OBJ_cmp(ex->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}